

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O2

Heap * CreateHeap(Raw raw,Size userSize)

{
  byte *pbVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  
  if (0x458 < userSize) {
    for (lVar4 = 2; lVar4 != 0x42; lVar4 = lVar4 + 1) {
      *(undefined8 *)((long)raw + lVar4 * 8 + 0x200) = 0;
      *(undefined8 *)((long)raw + lVar4 * 8) = 0;
    }
    *(byte *)((long)raw + 0x410) = *(byte *)((long)raw + 0x410) | 1;
    SetSize((Chuck *)((long)raw + 0x40c),userSize - 0x42c & 0xfffffffffffffff8);
    puVar2 = (uint *)((long)raw + (ulong)(*(uint *)((long)raw + 0x410) >> 1) * 8 + 0x410);
    *puVar2 = *puVar2 & 0xfffffffe;
    *(undefined8 *)((long)raw + 0x414) = 0;
    *(undefined8 *)((long)raw + 0x41c) = 0;
    uVar3 = *(uint *)((long)raw + 0x410) >> 1;
    lVar4 = (long)raw + (ulong)uVar3 * 8 + 0x40c;
    *(uint *)((long)raw + (ulong)uVar3 * 8 + 0x410) =
         *(uint *)((long)raw + (ulong)uVar3 * 8 + 0x410) & 1 | 6;
    *(undefined4 *)((long)raw + (ulong)uVar3 * 8 + 0x424) = 3;
    pbVar1 = (byte *)((long)raw + (ulong)uVar3 * 8 + 0x428);
    *pbVar1 = *pbVar1 | 1;
    *(long *)((long)raw + (ulong)uVar3 * 8 + 0x41c) = lVar4;
    *(long *)((long)raw + (ulong)uVar3 * 8 + 0x414) = lVar4;
    *(undefined8 *)raw = 0;
    *(undefined8 *)((long)raw + 8) = 0;
    MoveIn((Heap *)raw,(Chuck *)((long)raw + 0x40c));
    return (Heap *)raw;
  }
  __assert_fail("userSize > sizeof(Heap) + sizeof(Chuck) * 3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/Heap.c"
                ,9,"Heap *CreateHeap(Raw, Size)");
}

Assistant:

Heap *CreateHeap(Raw raw, Size userSize) {
    assert(userSize > sizeof(Heap) + sizeof(Chuck) * 3);
    Heap *heap = (Heap *) raw;
    for (int i = 0; i < 64; i += 1) {
        heap->exact[i] = heap->sorted[i] = NULL;
    }
    Chuck *firstChuck =
            (Chuck *) ((Bytes) raw + sizeof(Heap) - sizeof(uint32_t));
    firstChuck->lowerUsed = 1;
    Size initialSize =
            (userSize - sizeof(Heap) - sizeof(Chuck) - sizeof(uint32_t))
                    >> 3u << 3u;
    SetSize(firstChuck, initialSize);
    SetUsed(firstChuck, 0);
    SetPrev(firstChuck, NULL);
    SetNext(firstChuck, NULL);
    Chuck *endingOverhead = GetHigher(firstChuck);
    SetSize(endingOverhead, sizeof(Chuck));
    SetUsed(endingOverhead, 1);
    SetPrev(endingOverhead, endingOverhead);
    SetNext(endingOverhead, endingOverhead);
    heap->head = heap->last = NULL;
    MoveIn(heap, firstChuck);
    return heap;
}